

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

void __thiscall QCompletionEngine::filter(QCompletionEngine *this,QStringList *parts)

{
  QStringList *this_00;
  QList<int> *this_01;
  QModelIndex *pQVar1;
  QString *pQVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayData *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  QArrayData *local_88;
  QArrayData *pQStack_80;
  QAbstractItemModel *local_78;
  QMatchData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = (long *)QAbstractProxyModel::sourceModel();
  this_00 = &this->curParts;
  QArrayDataPointer<QString>::operator=(&this_00->d,&parts->d);
  if ((this->curParts).d.size == 0) {
    local_68.indices._0_8_ = (QArrayData *)0x0;
    local_68.indices.vector.d.d = (Data *)0x0;
    local_68.indices.vector.d.ptr._0_4_ = 0;
    local_68.indices.vector.d.ptr._4_4_ = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)this_00,0,(QString *)&local_68);
    QList<QString>::end(this_00);
    if ((QArrayData *)local_68.indices._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68.indices._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68.indices._0_8_)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68.indices._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_68.indices._0_8_,2,0x10);
      }
    }
  }
  this->curRow = -1;
  (this->curParent).r = -1;
  (this->curParent).c = -1;
  (this->curParent).i = 0;
  (this->curParent).m.ptr = (QAbstractItemModel *)0x0;
  local_68.indices._0_8_ = local_68.indices._0_8_ & 0xffffffffffffff00;
  local_68.indices.vector.d.d = (Data *)0x0;
  local_68.indices.vector.d.ptr._0_4_ = 0;
  local_68.indices.vector.d.ptr._4_4_ = 0;
  local_68.indices.vector.d.size._0_4_ = 0;
  local_68.indices.vector.d.size._4_4_ = 0;
  local_68.indices.f = 0;
  local_68.indices.t = -1;
  local_68.exactMatchIndex = -1;
  local_68.partial = false;
  (this->curMatch).indices.v = false;
  this_01 = &(this->curMatch).indices.vector;
  QArrayDataPointer<int>::operator=(&this_01->d,&local_68.indices.vector.d);
  (this->curMatch).indices.f = local_68.indices.f;
  (this->curMatch).indices.t = local_68.indices.t;
  (this->curMatch).partial = local_68.partial;
  (this->curMatch).exactMatchIndex = local_68.exactMatchIndex;
  if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  filterHistory(&local_68,this);
  (this->historyMatch).indices.v = local_68.indices.v;
  QArrayDataPointer<int>::operator=
            (&(this->historyMatch).indices.vector.d,&local_68.indices.vector.d);
  (this->historyMatch).indices.f = local_68.indices.f;
  (this->historyMatch).indices.t = local_68.indices.t;
  (this->historyMatch).partial = local_68.partial;
  (this->historyMatch).exactMatchIndex = local_68.exactMatchIndex;
  if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (plVar4 != (long *)0x0) {
    local_88 = (QArrayData *)0xffffffffffffffff;
    pQStack_80 = (QArrayData *)0x0;
    local_78 = (QAbstractItemModel *)0x0;
    if (1 < (ulong)(this->curParts).d.size) {
      lVar6 = 0x10;
      lVar5 = 0;
      do {
        pQVar2 = (this->curParts).d.ptr;
        local_a8 = *(QArrayData **)((long)pQVar2 + lVar6 + -0x10);
        uStack_a0 = *(undefined8 *)((long)pQVar2 + lVar6 + -8);
        local_98 = *(undefined8 *)((long)&(pQVar2->d).d + lVar6);
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        (*this->_vptr_QCompletionEngine[3])(&local_68,this,&local_a8,&local_88,0xffffffff);
        iVar3 = local_68.exactMatchIndex;
        if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
          }
        }
        if (iVar3 == -1) {
          if (local_a8 != (QArrayData *)0x0) {
            LOCK();
            (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_a8,2,0x10);
            }
          }
          goto LAB_006577c7;
        }
        (**(code **)(*plVar4 + 0x60))(&local_68,plVar4,iVar3,this->c->column,&local_88);
        local_78 = (QAbstractItemModel *)
                   CONCAT44(local_68.indices.vector.d.ptr._4_4_,local_68.indices.vector.d.ptr._0_4_)
        ;
        local_88 = (QArrayData *)local_68.indices._0_8_;
        pQStack_80 = &(local_68.indices.vector.d.d)->super_QArrayData;
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8,2,0x10);
          }
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar5 < (this->curParts).d.size + -1);
    }
    pQVar1 = &this->curParent;
    (this->curParent).m.ptr = local_78;
    *(QArrayData **)pQVar1 = local_88;
    (this->curParent).i = (quintptr)pQStack_80;
    pQVar2 = (this->curParts).d.ptr;
    lVar5 = (this->curParts).d.size;
    if (pQVar2[lVar5 + -1].d.size == 0) {
      local_68.indices.t = (**(code **)(*plVar4 + 0x78))(plVar4,pQVar1);
      local_68.indices.t = local_68.indices.t + -1;
      local_68.indices.f = 0;
      local_68.indices._0_8_ = local_68.indices._0_8_ & 0xffffffffffffff00;
      local_68.indices.vector.d.d = (Data *)0x0;
      local_68.indices.vector.d.ptr._0_4_ = 0;
      local_68.indices.vector.d.ptr._4_4_ = 0;
      local_68.indices.vector.d.size._0_4_ = 0;
      local_68.indices.vector.d.size._4_4_ = 0;
      local_68.exactMatchIndex = -1;
      local_68.partial = false;
      (this->curMatch).indices.v = false;
    }
    else {
      (*this->_vptr_QCompletionEngine[3])(&local_68,this,pQVar2 + lVar5 + -1,pQVar1,1);
      (this->curMatch).indices.v = local_68.indices.v;
    }
    QArrayDataPointer<int>::operator=(&this_01->d,&local_68.indices.vector.d);
    (this->curMatch).indices.f = local_68.indices.f;
    (this->curMatch).indices.t = local_68.indices.t;
    (this->curMatch).partial = local_68.partial;
    (this->curMatch).exactMatchIndex = local_68.exactMatchIndex;
    if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
      }
    }
    if ((this->curMatch).indices.v == true) {
      bVar7 = (this->curMatch).indices.vector.d.size == 0;
    }
    else {
      bVar7 = (this->curMatch).indices.t < (this->curMatch).indices.f;
    }
    this->curRow = -(uint)bVar7;
  }
LAB_006577c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompletionEngine::filter(const QStringList& parts)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();
    curParts = parts;
    if (curParts.isEmpty())
        curParts.append(QString());

    curRow = -1;
    curParent = QModelIndex();
    curMatch = QMatchData();
    historyMatch = filterHistory();

    if (!model)
        return;

    QModelIndex parent;
    for (int i = 0; i < curParts.size() - 1; i++) {
        QString part = curParts.at(i);
        int emi = filter(part, parent, -1).exactMatchIndex;
        if (emi == -1)
            return;
        parent = model->index(emi, c->column, parent);
    }

    // Note that we set the curParent to a valid parent, even if we have no matches
    // When filtering is disabled, we show all the items under this parent
    curParent = parent;
    if (curParts.constLast().isEmpty())
        curMatch = QMatchData(QIndexMapper(0, model->rowCount(curParent) - 1), -1, false);
    else
        curMatch = filter(curParts.constLast(), curParent, 1); // build at least one
    curRow = curMatch.isValid() ? 0 : -1;
}